

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase461::run(TestCase461 *this)

{
  PointerReader reader;
  Builder reader_00;
  Reader reader_01;
  ulong uVar1;
  long lVar2;
  Orphanage OVar3;
  ListSchema schema;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  Builder root2;
  Orphan<capnp::DynamicList> orphan;
  Builder root1;
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  undefined1 local_3b8 [28];
  uint uStack_39c;
  byte *local_398;
  ListElementCount LStack_390;
  BitsPerElementN<23> BStack_38c;
  StructDataBitCount local_388;
  StructPointerCount SStack_384;
  ElementSize EStack_382;
  undefined1 uStack_381;
  int iStack_380;
  undefined4 uStack_37c;
  PointerBuilder local_378;
  undefined8 local_360;
  short local_354;
  undefined4 local_350;
  SegmentBuilder *local_348;
  CapTableBuilder *pCStack_340;
  undefined8 local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  OrphanBuilder local_328;
  Orphan<capnp::DynamicList> local_308;
  ListBuilder local_2d8;
  StructBuilder local_2b0;
  Reader local_288;
  SegmentBuilder *local_248;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_240;
  SegmentReader *local_238;
  WirePointer *pWStack_230;
  byte *local_228;
  ListElementCount LStack_220;
  BitsPerElementN<23> BStack_21c;
  StructDataBitCount local_218;
  StructPointerCount SStack_214;
  ElementSize EStack_212;
  undefined1 uStack_211;
  int iStack_210;
  undefined4 uStack_20c;
  MallocMessageBuilder local_208;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,0x400,GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder(&local_208,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_308,&local_118.super_MessageBuilder);
  local_3b8._16_8_ = local_308.builder.tag.content;
  local_3b8._0_2_ = local_308.schema.elementType.baseType;
  local_3b8[2] = local_308.schema.elementType.listDepth;
  local_3b8[3] = local_308.schema.elementType.isImplicitParam;
  local_3b8._4_2_ = local_308.schema.elementType.field_3;
  local_3b8._6_2_ = local_308.schema.elementType._6_2_;
  local_3b8._8_8_ = local_308.schema.elementType.field_4;
  PointerBuilder::initStruct(&local_2b0,(PointerBuilder *)local_3b8,(StructSize)0x10000);
  local_378.segment = (SegmentBuilder *)0x220000000c;
  local_378.capTable = (CapTableBuilder *)CONCAT44(local_378.capTable._4_4_,0x38);
  local_308.schema.elementType._0_8_ = local_2b0.segment;
  local_308.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_2b0.capTable;
  local_308.builder.tag.content = (uint64_t)local_2b0.pointers;
  PointerBuilder::initList((ListBuilder *)local_3b8,(PointerBuilder *)&local_308,FOUR_BYTES,3);
  uVar1 = 0;
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&((WireValue<uint32_t> *)local_3b8._16_8_)->value + (uVar1 >> 3)) =
         *(undefined4 *)((long)&local_378.segment + lVar2);
    lVar2 = lVar2 + 4;
    uVar1 = uVar1 + uStack_39c;
  } while (lVar2 != 0xc);
  OVar3 = MessageBuilder::getOrphanage(&local_208.super_MessageBuilder);
  StructBuilder::asReader(&local_2b0);
  pCStack_340 = local_378.capTable;
  local_348 = local_378.segment;
  if (local_354 == 0) {
    local_350 = 0x7fffffff;
    local_360 = 0;
    pCStack_340 = (CapTableBuilder *)0x0;
    local_348 = (SegmentBuilder *)0x0;
  }
  local_338 = local_360;
  uStack_330 = local_350;
  schema = ListSchema::of(UINT32);
  reader._28_4_ = uStack_32c;
  reader.nestingLimit = uStack_330;
  reader.capTable = &pCStack_340->super_CapTableReader;
  reader.segment = &local_348->super_SegmentReader;
  reader.pointer = (WirePointer *)local_338;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic((Reader *)&local_248,reader,schema)
  ;
  local_3b8._0_8_ = local_248;
  local_3b8._8_8_ = aStack_240;
  local_388 = local_218;
  SStack_384 = SStack_214;
  EStack_382 = EStack_212;
  uStack_381 = uStack_211;
  iStack_380 = iStack_210;
  uStack_37c = uStack_20c;
  local_398 = local_228;
  LStack_390 = LStack_220;
  BStack_38c = BStack_21c;
  local_3b8._16_8_ = local_238;
  stack0xfffffffffffffc60 = pWStack_230;
  OrphanBuilder::copy(&local_328,(EVP_PKEY_CTX *)OVar3.arena,(EVP_PKEY_CTX *)OVar3.capTable);
  local_308.schema.elementType._0_8_ = local_248;
  local_308.schema.elementType.field_4.schema = aStack_240.schema;
  local_308.builder.capTable = local_328.capTable;
  local_308.builder.location = local_328.location;
  local_308.builder.tag.content = local_328.tag.content;
  local_308.builder.segment = local_328.segment;
  Orphan<capnp::DynamicList>::getReader(&local_288,&local_308);
  local_3b8._0_8_ = (SegmentBuilder *)0x220000000c;
  local_3b8._8_4_ = 0x38;
  reader_01.schema.elementType.field_4.schema = local_288.schema.elementType.field_4.schema;
  reader_01.schema.elementType.baseType = local_288.schema.elementType.baseType;
  reader_01.schema.elementType.listDepth = local_288.schema.elementType.listDepth;
  reader_01.schema.elementType.isImplicitParam = local_288.schema.elementType.isImplicitParam;
  reader_01.schema.elementType.field_3 = local_288.schema.elementType.field_3;
  reader_01.schema.elementType._6_2_ = local_288.schema.elementType._6_2_;
  reader_01.reader.segment = local_288.reader.segment;
  reader_01.reader.capTable = local_288.reader.capTable;
  reader_01.reader.ptr = local_288.reader.ptr;
  reader_01.reader.elementCount = local_288.reader.elementCount;
  reader_01.reader.step = local_288.reader.step;
  reader_01.reader.structDataSize = local_288.reader.structDataSize;
  reader_01.reader.structPointerCount = local_288.reader.structPointerCount;
  reader_01.reader.elementSize = local_288.reader.elementSize;
  reader_01.reader._39_1_ = local_288.reader._39_1_;
  reader_01.reader.nestingLimit = local_288.reader.nestingLimit;
  reader_01.reader._44_4_ = local_288.reader._44_4_;
  expected._M_len = 3;
  expected._M_array = (iterator)local_3b8;
  checkList<unsigned_int,capnp::DynamicList::Reader>(reader_01,expected);
  MessageBuilder::getRootInternal((Builder *)&local_328,&local_208.super_MessageBuilder);
  local_378.pointer = (WirePointer *)local_328.capTable;
  local_378.segment = (SegmentBuilder *)local_328.tag.content;
  local_378.capTable = (CapTableBuilder *)local_328.segment;
  PointerBuilder::initStruct((StructBuilder *)local_3b8,&local_378,(StructSize)0x10000);
  local_378.segment = (SegmentBuilder *)local_3b8._0_8_;
  local_378.capTable = (CapTableBuilder *)local_3b8._8_8_;
  local_378.pointer = stack0xfffffffffffffc60;
  PointerBuilder::adopt(&local_378,&local_308.builder);
  local_378.segment = (SegmentBuilder *)local_3b8._0_8_;
  local_378.capTable = (CapTableBuilder *)local_3b8._8_8_;
  local_378.pointer = stack0xfffffffffffffc60;
  PointerBuilder::getList(&local_2d8,&local_378,FOUR_BYTES,(word *)0x0);
  local_378.segment = (SegmentBuilder *)0x220000000c;
  local_378.capTable = (CapTableBuilder *)CONCAT44(local_378.capTable._4_4_,0x38);
  reader_00.builder.capTable = local_2d8.capTable;
  reader_00.builder.segment = local_2d8.segment;
  reader_00.builder.ptr = local_2d8.ptr;
  reader_00.builder.elementCount = local_2d8.elementCount;
  reader_00.builder.step = local_2d8.step;
  reader_00.builder.structDataSize = local_2d8.structDataSize;
  reader_00.builder.structPointerCount = local_2d8.structPointerCount;
  reader_00.builder.elementSize = local_2d8.elementSize;
  reader_00.builder._39_1_ = local_2d8._39_1_;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&local_378;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_00,expected_00);
  if (local_308.builder.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_308.builder);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_208);
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return;
}

Assistant:

TEST(Orphans, OrphanageDynamicListCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<test::TestAnyPointer>();
  root1.getAnyPointerField().setAs<List<uint32_t>>({12, 34, 56});

  Orphan<DynamicList> orphan = builder2.getOrphanage().newOrphanCopy(
      root1.asReader().getAnyPointerField().getAs<DynamicList>(Schema::from<List<uint32_t>>()));
  checkList<uint32_t>(orphan.getReader(), {12, 34, 56});

  auto root2 = builder2.initRoot<test::TestAnyPointer>();
  root2.getAnyPointerField().adopt(kj::mv(orphan));
  checkList(root2.getAnyPointerField().getAs<List<uint32_t>>(), {12u, 34u, 56u});
}